

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr64.cpp
# Opt level: O2

void __thiscall
icu_63::UVector64::insertElementAt(UVector64 *this,int64_t elem,int32_t index,UErrorCode *status)

{
  int iVar1;
  int64_t *piVar2;
  UBool UVar3;
  long lVar4;
  
  if (((-1 < index) && (index <= this->count)) &&
     (UVar3 = ensureCapacity(this,this->count + 1,status), UVar3 != '\0')) {
    iVar1 = this->count;
    piVar2 = this->elements;
    for (lVar4 = (long)iVar1; (long)(ulong)(uint)index < lVar4; lVar4 = lVar4 + -1) {
      piVar2[lVar4] = piVar2[lVar4 + -1];
    }
    piVar2[(uint)index] = elem;
    this->count = iVar1 + 1;
  }
  return;
}

Assistant:

void UVector64::insertElementAt(int64_t elem, int32_t index, UErrorCode &status) {
    // must have 0 <= index <= count
    if (0 <= index && index <= count && ensureCapacity(count + 1, status)) {
        for (int32_t i=count; i>index; --i) {
            elements[i] = elements[i-1];
        }
        elements[index] = elem;
        ++count;
    }
    /* else index out of range */
}